

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long lVar2;
  char *__s;
  double *pdVar3;
  undefined1 uVar4;
  int *piVar5;
  ostream *poVar6;
  long *plVar7;
  size_t sVar8;
  char **ppcVar9;
  double *time;
  size_t size;
  ulong uVar10;
  double *pdVar11;
  initializer_list<int> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<const_char_*> __l_01;
  vector<const_char_*,_std::allocator<const_char_*>_> structure;
  Treap<unsigned_long> tp;
  SplayTree<unsigned_long> st;
  vector<unsigned_long,_std::allocator<unsigned_long>_> insertable;
  vector<unsigned_long,_std::allocator<unsigned_long>_> whole;
  vector<unsigned_long,_std::allocator<unsigned_long>_> init;
  vector<const_char_*,_std::allocator<const_char_*>_> ops;
  vector<unsigned_long,_std::allocator<unsigned_long>_> eraseable;
  vector<unsigned_long,_std::allocator<unsigned_long>_> findable;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> set;
  vector<int,_std::allocator<int>_> n;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  res;
  char **local_1c8;
  char *pcStack_1c0;
  char *local_1b8;
  long lStack_1b0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1a8;
  Treap<unsigned_long> local_190;
  SplayTree<unsigned_long> local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_150;
  long *local_138 [2];
  long local_128 [2];
  int *local_118;
  int *local_110;
  vector<const_char_*,_std::allocator<const_char_*>_> local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_90;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_90._M_impl._0_8_ = 0x186a000004e20;
  local_90._M_impl.super__Rb_tree_header._M_header._0_8_ = 0x2625a00007a120;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_90;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_1c8);
  local_118 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
  piVar5 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      iVar1 = *piVar5;
      local_110 = piVar5;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," elements",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_188.root = (Node *)0x0;
      local_190.root = (Node *)0x0;
      local_90._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_90._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_impl.super__Rb_tree_header._M_header;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      randVec(&local_150,(long)iVar1);
      size = (size_t)(iVar1 / 10);
      randVec(&local_180,size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_168,&local_150);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                 local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a8,&local_168);
      getRandomPart(&local_d8,&local_a8,size);
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,&local_168);
      getRandomPart(&local_f0,&local_c0,size);
      if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      initialize<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                (&local_150,&local_188,&local_190,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_90);
      run<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                (&local_48,&local_180,&local_d8,&local_f0,&local_188,&local_190,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_90);
      local_1b8 = "erase";
      local_1c8 = (char **)0x1050e6;
      pcStack_1c0 = "find ";
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&local_1c8;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_108,__l_00,(allocator_type *)local_138);
      local_1b8 = "std::set";
      local_1c8 = (char **)0x10503e;
      pcStack_1c0 = "Treap ";
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)&local_1c8;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_1a8,__l_01,(allocator_type *)local_138);
      lVar2 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
      lVar2 = *(long *)(lVar2 + -0x18);
      if (*(char *)(lVar2 + 0x10a1b1) == '\0') {
        uVar4 = std::ios::widen((char)lVar2 + -0x30);
        *(undefined1 *)(lVar2 + 0x10a1b0) = uVar4;
        *(undefined1 *)(lVar2 + 0x10a1b1) = 1;
      }
      *(undefined1 *)(lVar2 + 0x10a1b0) = 0x20;
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xd;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
      if (local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar10 = 0;
        do {
          *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xd;
          local_138[0] = local_128;
          std::__cxx11::string::_M_construct((ulong)local_138,(char)uVar10);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_138);
          local_1c8 = &local_1b8;
          ppcVar9 = (char **)(plVar7 + 2);
          if ((char **)*plVar7 == ppcVar9) {
            local_1b8 = *ppcVar9;
            lStack_1b0 = plVar7[3];
          }
          else {
            local_1b8 = *ppcVar9;
            local_1c8 = (char **)*plVar7;
          }
          pcStack_1c0 = (char *)plVar7[1];
          *plVar7 = (long)ppcVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1c8,(long)pcStack_1c0);
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,(ulong)(local_1b8 + 1));
          }
          if (local_138[0] != local_128) {
            operator_delete(local_138[0],local_128[0] + 1);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)local_1a8.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1a8.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      if (local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar10 = 0;
        do {
          lVar2 = std::cout;
          *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xd;
          __s = local_108.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(lVar2 + -0x18) + 0x10a0d0);
          }
          else {
            sVar8 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar8);
          }
          pdVar3 = local_48.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar11 = local_48.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar10].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start; pdVar11 != pdVar3; pdVar11 = pdVar11 + 1)
          {
            *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xd;
            poVar6 = std::ostream::_M_insert<double>(*pdVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
          std::ostream::put(-0x30);
          std::ostream::flush();
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)local_1a8.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1a8.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a8.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_48);
      if (local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_90);
      Treap<unsigned_long>::~Treap(&local_190);
      SplayTree<unsigned_long>::~SplayTree(&local_188);
      piVar5 = local_110 + 1;
    } while (local_110 + 1 != local_118);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
  std::vector n{20'000, 100'000, 500'000, 2'500'000};

  for (auto n : n) {
    std::cout << n << " elements" << std::endl;

    SplayTree<std::uint64_t> st;
    Treap<std::uint64_t> tp;
    std::set<std::uint64_t> set;

    auto init = randVec(n);
    auto insertable = randVec(n / 10);

    auto whole = init;
    whole.insert(whole.end(), insertable.begin(), insertable.end());

    auto findable = getRandomPart(whole, n / 10);
    auto eraseable = getRandomPart(whole, n / 10);

    initialize(init, st, tp, set);
    auto res = run(insertable, findable, eraseable, st, tp, set);

    std::vector ops{"insert", "find ", "erase"};
    std::vector structure{"SplayTree", "Treap ", "std::set"};

    std::cout << std::left << std::setfill(' ') << std::setw(13) << "";
    for (std::size_t i = 0; i < structure.size(); ++i)
      std::cout << std::setw(13) << std::string(i, ' ') + structure[i];
    std::cout << std::endl;

    for (std::size_t i = 0; i < structure.size(); ++i) {
      std::cout << std::setw(13) << ops[i];
      for (auto &time : res[i])
        std::cout << std::setw(13) << time << " ";
      std::cout << std::endl;
    }
  }
}